

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testmap.cpp
# Opt level: O2

void change_setting_proc(Am_Object *self)

{
  bool bVar1;
  char cVar2;
  Am_Value_Type AVar3;
  uint uVar4;
  int iVar5;
  Am_Value *pAVar6;
  Am_Object *pAVar7;
  ulong uVar8;
  Am_Input_Char c;
  Am_Value local_60;
  Am_Alignment h_align;
  Am_Object local_48;
  Am_Input_Char local_40;
  Am_Input_Char local_3c;
  Am_Input_Char local_38;
  Am_Input_Char local_34;
  Am_Input_Char local_30;
  Am_Input_Char local_2c;
  Am_Input_Char local_28;
  Am_Input_Char local_24;
  Am_Input_Char local_20;
  Am_Input_Char local_1c;
  Am_Input_Char local_18;
  Am_Input_Char local_14;
  Am_Object inter;
  
  Am_Object::Get_Owner(&inter,(Am_Slot_Flags)self);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&inter,0x11b);
  Am_Input_Char::Am_Input_Char(&c,pAVar6);
  Am_Input_Char::Am_Input_Char(&local_14,"q",true);
  bVar1 = Am_Input_Char::operator==(&c,local_14);
  if (bVar1) {
    Am_Exit_Main_Event_Loop();
  }
  else {
    Am_Input_Char::Am_Input_Char(&local_18,"S",true);
    bVar1 = Am_Input_Char::operator==(&c,local_18);
    if (bVar1) {
      uVar4 = (uint)change_setting_proc(Am_Object)::switcher;
      change_setting_proc(Am_Object)::switcher = (byte)(uVar4 ^ 1);
      Am_Object::Set(0x6228,0xa2,(ulong)((uVar4 ^ 1) * 4 + 4));
    }
    else {
      Am_Input_Char::Am_Input_Char(&local_1c,"T",true);
      bVar1 = Am_Input_Char::operator==(&c,local_1c);
      if (bVar1) {
        if ((change_setting_proc(Am_Object)::instance == '\0') &&
           (iVar5 = __cxa_guard_acquire(&change_setting_proc(Am_Object)::instance), iVar5 != 0)) {
          change_setting_proc::instance.data = (Am_Object_Data *)0x0;
          __cxa_atexit(Am_Object::~Am_Object,&change_setting_proc::instance,&__dso_handle);
          __cxa_guard_release(&change_setting_proc(Am_Object)::instance);
        }
        cVar2 = Am_Object::Valid();
        if (cVar2 == '\0') {
          Am_Object::Create((char *)&local_60);
          pAVar7 = (Am_Object *)Am_Object::Set((ushort)&local_60,0x65,0x32);
          Am_Object::operator=(&change_setting_proc::instance,pAVar7);
          Am_Object::~Am_Object((Am_Object *)&local_60);
          Am_Object::Am_Object(&local_48,&change_setting_proc::instance);
          Am_Object::Add_Part((Am_Object)0x106220,SUB81(&local_48,0),1);
          Am_Object::~Am_Object(&local_48);
        }
        else {
          Am_Object::Destroy();
        }
      }
      else {
        Am_Input_Char::Am_Input_Char(&local_20,"s",true);
        bVar1 = Am_Input_Char::operator==(&c,local_20);
        if (bVar1) {
          pAVar6 = (Am_Value *)Am_Object::Get(0x6238,(ulong)STAGGER);
          bVar1 = Am_Value::operator_cast_to_bool(pAVar6);
          Am_Object::Set(0x6238,SUB21(STAGGER,0),(ulong)!bVar1);
          pAVar6 = (Am_Value *)Am_Object::Get(0x6248,(ulong)STAGGER);
          bVar1 = Am_Value::operator_cast_to_bool(pAVar6);
          Am_Object::Set(0x6248,SUB21(STAGGER,0),(ulong)!bVar1);
        }
        else {
          Am_Input_Char::Am_Input_Char(&local_24,"r",true);
          bVar1 = Am_Input_Char::operator==(&c,local_24);
          if (bVar1) {
            AVar3 = Am_Object::Get_Slot_Type(&layout1,0x9c,0);
            if (AVar3 == 2) {
              pAVar6 = (Am_Value *)Am_Object::Get(0x6230,0x9c);
              iVar5 = Am_Value::operator_cast_to_int(pAVar6);
              uVar8 = (ulong)((uint)(iVar5 == 0) * 3);
            }
            else {
              uVar8 = 3;
            }
            Am_Object::Set(0x6230,0x9c,uVar8);
            AVar3 = Am_Object::Get_Slot_Type(&layout2,0x9c,0);
            if (AVar3 == 2) {
              pAVar6 = (Am_Value *)Am_Object::Get(0x6240,0x9c);
              iVar5 = Am_Value::operator_cast_to_int(pAVar6);
              uVar8 = (ulong)((uint)(iVar5 == 0) * 3);
            }
            else {
              uVar8 = 3;
            }
            Am_Object::Set(0x6240,0x9c,uVar8);
          }
          else {
            uVar8 = 1;
            Am_Input_Char::Am_Input_Char(&local_28,"1",true);
            bVar1 = Am_Input_Char::operator==(&c,local_28);
            if (bVar1) {
              AVar3 = Am_Object::Get_Slot_Type(&layout1,0x9c,0);
              if (AVar3 == 2) {
                pAVar6 = (Am_Value *)Am_Object::Get(0x6230,0x9c);
                iVar5 = Am_Value::operator_cast_to_int(pAVar6);
                uVar8 = (ulong)(iVar5 == 0);
              }
              Am_Object::Set(0x6230,0x9c,uVar8);
              AVar3 = Am_Object::Get_Slot_Type(&layout2,0x9c,0);
              if (AVar3 == 2) {
                pAVar6 = (Am_Value *)Am_Object::Get(0x6240,0x9c);
                iVar5 = Am_Value::operator_cast_to_int(pAVar6);
                uVar8 = (ulong)(iVar5 == 0);
              }
              else {
                uVar8 = 1;
              }
              Am_Object::Set(0x6240,0x9c,uVar8);
            }
            else {
              Am_Input_Char::Am_Input_Char(&local_2c,"z",true);
              bVar1 = Am_Input_Char::operator==(&c,local_2c);
              if (bVar1) {
                AVar3 = Am_Object::Get_Slot_Type(&layout1,0x9d,0);
                if (AVar3 == 2) {
                  pAVar6 = (Am_Value *)Am_Object::Get(0x6230,0x9d);
                  iVar5 = Am_Value::operator_cast_to_int(pAVar6);
                  uVar8 = 0x46;
                  if (iVar5 != 0) {
                    uVar8 = 0;
                  }
                }
                else {
                  uVar8 = 0x46;
                }
                Am_Object::Set(0x6230,0x9d,uVar8);
                AVar3 = Am_Object::Get_Slot_Type(&layout2,0x9d,0);
                if (AVar3 == 2) {
                  pAVar6 = (Am_Value *)Am_Object::Get(0x6240,0x9d);
                  iVar5 = Am_Value::operator_cast_to_int(pAVar6);
                  uVar8 = 0x5e;
                  if (iVar5 != 0) {
                    uVar8 = 0;
                  }
                }
                else {
                  uVar8 = 0x5e;
                }
                Am_Object::Set(0x6240,0x9d,uVar8);
              }
              else {
                Am_Input_Char::Am_Input_Char(&local_30,"w",true);
                bVar1 = Am_Input_Char::operator==(&c,local_30);
                if (bVar1) {
                  pAVar6 = (Am_Value *)Am_Object::Get(0x6230,0x99);
                  iVar5 = Am_Value::operator_cast_to_int(pAVar6);
                  Am_Object::Set(0x6230,0x99,(ulong)(iVar5 == 0));
                  pAVar6 = (Am_Value *)Am_Object::Get(0x6240,0x99);
                  iVar5 = Am_Value::operator_cast_to_int(pAVar6);
                  Am_Object::Set(0x6240,0x99,(ulong)(iVar5 == 0));
                }
                else {
                  Am_Input_Char::Am_Input_Char(&local_34,"h",true);
                  bVar1 = Am_Input_Char::operator==(&c,local_34);
                  if (bVar1) {
                    pAVar6 = (Am_Value *)Am_Object::Get(0x6230,0x9a);
                    iVar5 = Am_Value::operator_cast_to_int(pAVar6);
                    Am_Object::Set(0x6230,0x9a,(ulong)(iVar5 == 0));
                    pAVar6 = (Am_Value *)Am_Object::Get(0x6240,0x9a);
                    iVar5 = Am_Value::operator_cast_to_int(pAVar6);
                    Am_Object::Set(0x6240,0x9a,(ulong)(iVar5 == 0));
                  }
                  else {
                    Am_Input_Char::Am_Input_Char(&local_38,"a",true);
                    bVar1 = Am_Input_Char::operator==(&c,local_38);
                    if (bVar1) {
                      pAVar6 = (Am_Value *)Am_Object::Get(0x6230,0x97);
                      Am_Alignment::Am_Alignment(&h_align,pAVar6);
                      if (h_align.value == Am_LEFT_ALIGN_val) {
                        local_60.value.long_value._4_4_ = 0;
                        local_60.value.float_value = (float)Am_RIGHT_ALIGN.value;
                        local_60.type = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
                        Am_Object::Set(0x6230,(Am_Value *)0x97,(ulong)&local_60);
                      }
                      else if (h_align.value == Am_RIGHT_ALIGN_val) {
                        local_60.value.long_value._4_4_ = 0;
                        local_60.value.float_value = (float)Am_CENTER_ALIGN.value;
                        local_60.type = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
                        Am_Object::Set(0x6230,(Am_Value *)0x97,(ulong)&local_60);
                      }
                      else {
                        local_60.value.long_value._4_4_ = 0;
                        local_60.value.float_value = (float)Am_LEFT_ALIGN.value;
                        local_60.type = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
                        Am_Object::Set(0x6230,(Am_Value *)0x97,(ulong)&local_60);
                      }
                      Am_Value::~Am_Value(&local_60);
                      pAVar6 = (Am_Value *)Am_Object::Get(0x6240,0x97);
                      Am_Alignment::operator=(&h_align,pAVar6);
                      if (h_align.value == Am_RIGHT_ALIGN_val) {
                        local_60.value.long_value._4_4_ = 0;
                        local_60.value.float_value = (float)Am_CENTER_ALIGN.value;
                        local_60.type = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
                        Am_Object::Set(0x6240,(Am_Value *)0x97,(ulong)&local_60);
                      }
                      else if (h_align.value == Am_LEFT_ALIGN_val) {
                        local_60.value.long_value._4_4_ = 0;
                        local_60.value.float_value = (float)Am_RIGHT_ALIGN.value;
                        local_60.type = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
                        Am_Object::Set(0x6240,(Am_Value *)0x97,(ulong)&local_60);
                      }
                      else {
                        local_60.value.long_value._4_4_ = 0;
                        local_60.value.float_value = (float)Am_LEFT_ALIGN.value;
                        local_60.type = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
                        Am_Object::Set(0x6240,(Am_Value *)0x97,(ulong)&local_60);
                      }
                    }
                    else {
                      Am_Input_Char::Am_Input_Char(&local_3c,"b",true);
                      bVar1 = Am_Input_Char::operator==(&c,local_3c);
                      if (!bVar1) {
                        Am_Input_Char::Am_Input_Char(&local_40,"i",true);
                        bVar1 = Am_Input_Char::operator==(&c,local_40);
                        if (bVar1) {
                          pAVar6 = (Am_Value *)Am_Object::Get(0x6230,0x9b);
                          iVar5 = Am_Value::operator_cast_to_int(pAVar6);
                          uVar8 = 0;
                          if (iVar5 == 0) {
                            uVar8 = 10;
                          }
                          Am_Object::Set(0x6230,0x9b,uVar8);
                          pAVar6 = (Am_Value *)Am_Object::Get(0x6240,0x9b);
                          iVar5 = Am_Value::operator_cast_to_int(pAVar6);
                          uVar8 = 10;
                          if (iVar5 != 0) {
                            uVar8 = 0;
                          }
                          Am_Object::Set(0x6240,0x9b,uVar8);
                        }
                        else {
                          print_help();
                        }
                        goto LAB_001028a9;
                      }
                      pAVar6 = (Am_Value *)Am_Object::Get(0x6230,0x98);
                      Am_Alignment::Am_Alignment(&h_align,pAVar6);
                      if (h_align.value == Am_TOP_ALIGN_val) {
                        local_60.value.long_value._4_4_ = 0;
                        local_60.value.float_value = (float)Am_BOTTOM_ALIGN.value;
                        local_60.type = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
                        Am_Object::Set(0x6230,(Am_Value *)0x98,(ulong)&local_60);
                      }
                      else if (h_align.value == Am_BOTTOM_ALIGN_val) {
                        local_60.value.long_value._4_4_ = 0;
                        local_60.value.float_value = (float)Am_CENTER_ALIGN.value;
                        local_60.type = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
                        Am_Object::Set(0x6230,(Am_Value *)0x98,(ulong)&local_60);
                      }
                      else {
                        local_60.value.long_value._4_4_ = 0;
                        local_60.value.float_value = (float)Am_TOP_ALIGN.value;
                        local_60.type = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
                        Am_Object::Set(0x6230,(Am_Value *)0x98,(ulong)&local_60);
                      }
                      Am_Value::~Am_Value(&local_60);
                      pAVar6 = (Am_Value *)Am_Object::Get(0x6240,0x98);
                      Am_Alignment::operator=(&h_align,pAVar6);
                      if (h_align.value == Am_BOTTOM_ALIGN_val) {
                        local_60.value.long_value._4_4_ = 0;
                        local_60.value.float_value = (float)Am_CENTER_ALIGN.value;
                        local_60.type = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
                        Am_Object::Set(0x6240,(Am_Value *)0x98,(ulong)&local_60);
                      }
                      else if (h_align.value == Am_TOP_ALIGN_val) {
                        local_60.value.long_value._4_4_ = 0;
                        local_60.value.float_value = (float)Am_BOTTOM_ALIGN.value;
                        local_60.type = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
                        Am_Object::Set(0x6240,(Am_Value *)0x98,(ulong)&local_60);
                      }
                      else {
                        local_60.value.long_value._4_4_ = 0;
                        local_60.value.float_value = (float)Am_TOP_ALIGN.value;
                        local_60.type = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
                        Am_Object::Set(0x6240,(Am_Value *)0x98,(ulong)&local_60);
                      }
                    }
                    Am_Value::~Am_Value(&local_60);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001028a9:
  Am_Object::~Am_Object(&inter);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, change_setting, (Am_Object self))
{
  Am_Object inter = self.Get_Owner();
  Am_Input_Char c = inter.Get(Am_START_CHAR);
  if (c == "q") {
    Am_Exit_Main_Event_Loop();
  } else if (c == "S") {
    static bool switcher = false;
    if (switcher) {
      switcher = false;
      map1.Set(Am_ITEMS, 4);
    } else {
      switcher = true;
      map1.Set(Am_ITEMS, 8);
    }
  } else if (c == "T") {
    static Am_Object instance = nullptr;
    if (instance.Valid()) {
      instance.Destroy();
    } else {
      instance = map1.Create("map2").Set(Am_TOP, 50);
      window.Add_Part(instance);
    }
  } else if (c == "s") {
    bool stagger = layout_proto1.Get(STAGGER);
    layout_proto1.Set(STAGGER, !stagger);
    stagger = layout_proto2.Get(STAGGER);
    layout_proto2.Set(STAGGER, !stagger);
  } else if (c == "r") {
    int max_rank;
    if (layout1.Get_Slot_Type(Am_MAX_RANK) == Am_INT)
      max_rank = layout1.Get(Am_MAX_RANK);
    else
      max_rank = 0;
    layout1.Set(Am_MAX_RANK, max_rank ? 0 : 3);
    if (layout2.Get_Slot_Type(Am_MAX_RANK) == Am_INT)
      max_rank = layout2.Get(Am_MAX_RANK);
    else
      max_rank = 0;
    layout2.Set(Am_MAX_RANK, max_rank ? 0 : 3);
  } else if (c == "1") {
    int max_rank;
    if (layout1.Get_Slot_Type(Am_MAX_RANK) == Am_INT)
      max_rank = layout1.Get(Am_MAX_RANK);
    else
      max_rank = 0;
    layout1.Set(Am_MAX_RANK, max_rank ? 0 : 1);
    if (layout2.Get_Slot_Type(Am_MAX_RANK) == Am_INT)
      max_rank = layout2.Get(Am_MAX_RANK);
    else
      max_rank = 0;
    layout2.Set(Am_MAX_RANK, max_rank ? 0 : 1);
  } else if (c == "z") {
    int max_size;
    if (layout1.Get_Slot_Type(Am_MAX_SIZE) == Am_INT)
      max_size = layout1.Get(Am_MAX_SIZE);
    else
      max_size = 0;
    layout1.Set(Am_MAX_SIZE, max_size ? 0 : 70);
    if (layout2.Get_Slot_Type(Am_MAX_SIZE) == Am_INT)
      max_size = layout2.Get(Am_MAX_SIZE);
    else
      max_size = 0;
    layout2.Set(Am_MAX_SIZE, max_size ? 0 : 94);
  } else if (c == "w") {
    int fixed_width = layout1.Get(Am_FIXED_WIDTH);
    layout1.Set(Am_FIXED_WIDTH,
                fixed_width ? Am_NOT_FIXED_SIZE : Am_MAX_FIXED_SIZE);
    fixed_width = layout2.Get(Am_FIXED_WIDTH);
    layout2.Set(Am_FIXED_WIDTH,
                fixed_width ? Am_NOT_FIXED_SIZE : Am_MAX_FIXED_SIZE);
  } else if (c == "h") {
    int fixed_height = layout1.Get(Am_FIXED_HEIGHT);
    layout1.Set(Am_FIXED_HEIGHT,
                fixed_height ? Am_NOT_FIXED_SIZE : Am_MAX_FIXED_SIZE);
    fixed_height = layout2.Get(Am_FIXED_HEIGHT);
    layout2.Set(Am_FIXED_HEIGHT,
                fixed_height ? Am_NOT_FIXED_SIZE : Am_MAX_FIXED_SIZE);
  } else if (c == "a") {
    Am_Alignment h_align = layout1.Get(Am_H_ALIGN);
    switch (h_align.value) {
    case Am_LEFT_ALIGN_val:
      layout1.Set(Am_H_ALIGN, Am_RIGHT_ALIGN);
      break;
    case Am_RIGHT_ALIGN_val:
      layout1.Set(Am_H_ALIGN, Am_CENTER_ALIGN);
      break;
    default:
      layout1.Set(Am_H_ALIGN, Am_LEFT_ALIGN);
      break;
    }
    h_align = layout2.Get(Am_H_ALIGN);
    switch (h_align.value) {
    case Am_LEFT_ALIGN_val:
      layout2.Set(Am_H_ALIGN, Am_RIGHT_ALIGN);
      break;
    case Am_RIGHT_ALIGN_val:
      layout2.Set(Am_H_ALIGN, Am_CENTER_ALIGN);
      break;
    default:
      layout2.Set(Am_H_ALIGN, Am_LEFT_ALIGN);
      break;
    }
  } else if (c == "b") {
    Am_Alignment v_align = layout1.Get(Am_V_ALIGN);
    switch (v_align.value) {
    case Am_TOP_ALIGN_val:
      layout1.Set(Am_V_ALIGN, Am_BOTTOM_ALIGN);
      break;
    case Am_BOTTOM_ALIGN_val:
      layout1.Set(Am_V_ALIGN, Am_CENTER_ALIGN);
      break;
    default:
      layout1.Set(Am_V_ALIGN, Am_TOP_ALIGN);
      break;
    }
    v_align = layout2.Get(Am_V_ALIGN);
    switch (v_align.value) {
    case Am_TOP_ALIGN_val:
      layout2.Set(Am_V_ALIGN, Am_BOTTOM_ALIGN);
      break;
    case Am_BOTTOM_ALIGN_val:
      layout2.Set(Am_V_ALIGN, Am_CENTER_ALIGN);
      break;
    default:
      layout2.Set(Am_V_ALIGN, Am_TOP_ALIGN);
      break;
    }
  } else if (c == "i") {
    int indent = layout1.Get(Am_INDENT);
    layout1.Set(Am_INDENT, indent ? 0 : 10);
    indent = layout2.Get(Am_INDENT);
    layout2.Set(Am_INDENT, indent ? 0 : 10);
  } else
    print_help();
}